

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O1

bool __thiscall ScParser::parseFunctionCall(ScParser *this,char **data)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ScName target;
  ScHistoryMode historyMode;
  ScTarget local_48;
  
  if (this->m_hasCurrentState != true) {
    return false;
  }
  pcVar3 = *data;
  iVar2 = strncmp(pcVar3,"boost::statechart::detail::safe_reaction_result ",0x30);
  if (iVar2 == 0) {
    pcVar3 = pcVar3 + 0x30;
  }
  else {
    pcVar3 = *data;
    iVar2 = strncmp(pcVar3,"boost::statechart::detail::reaction_result ",0x2b);
    if (iVar2 != 0) goto LAB_001181d9;
    pcVar3 = pcVar3 + 0x2b;
  }
  *data = pcVar3;
LAB_001181d9:
  pcVar3 = *data;
  iVar2 = strncmp(pcVar3,"boost::statechart::simple_state<",0x20);
  if (iVar2 != 0) {
    return false;
  }
  pcVar3 = pcVar3 + 0x21;
  iVar2 = 1;
  do {
    *data = pcVar3 + -1;
    cVar1 = pcVar3[-1];
    if (cVar1 == '<') {
      iVar2 = iVar2 + 1;
    }
    else if (cVar1 == '>') {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        if (pcVar3[-2] == ' ') {
          pcVar3[-2] = '\0';
          *data = *data + 1;
        }
        else {
          *data = pcVar3;
          pcVar3[-1] = '\0';
        }
LAB_0011824e:
        pcVar3 = *data;
        iVar2 = strncmp(pcVar3,"::transit<",10);
        if (iVar2 == 0) {
          *data = pcVar3 + 10;
          matchTransitionTarget(&local_48,data);
          ScModel::addTransition
                    (this->m_model,&local_48.name,&this->m_currentEvent,local_48.historyMode);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48.name._M_dataplus._M_p != &local_48.name.field_2) {
            operator_delete(local_48.name._M_dataplus._M_p,
                            local_48.name.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pcVar3 = *data;
          iVar2 = strncmp(pcVar3,"::discard_event()",0x11);
          if (iVar2 != 0) {
            pcVar3 = *data;
            iVar2 = strncmp(pcVar3,"::defer_event()",0xf);
            if (iVar2 == 0) {
              *data = pcVar3 + 0xf;
              ScModel::addDeferral(this->m_model,&this->m_currentEvent);
              return true;
            }
            return true;
          }
          *data = pcVar3 + 0x11;
          ScModel::addTransition(this->m_model,&this->m_currentState,&this->m_currentEvent,None);
        }
        return true;
      }
    }
    else if (cVar1 == '\0') goto LAB_0011824e;
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

bool ScParser::parseFunctionCall(char *&data)
{
    if (!m_hasCurrentState) {
        return false;
    }

    // boost::statechart::detail::safe_reaction_result
    //     boost::statechart::simple_state<...>::transit<*state-name*>()

    if (!expectStartsWith(data, "boost::statechart::detail::safe_reaction_result ")) {
        expectStartsWith(data, "boost::statechart::detail::reaction_result ");
    }
    if (expectStartsWith(data, "boost::statechart::simple_state<")) {
        matchAngleArgument(data, true);
        if (expectStartsWith(data, "::transit<")) {
            auto [target, historyMode] = matchTransitionTarget(data);
            m_model.addTransition(target, m_currentEvent, historyMode);
        } else if (expectStartsWith(data, "::discard_event()")) {
            m_model.addTransition(m_currentState, m_currentEvent);
        } else if (expectStartsWith(data, "::defer_event()")) {
            m_model.addDeferral(m_currentEvent);
        }
        return true;
    }
    return false;
}